

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.hh
# Opt level: O3

void __thiscall
tchecker::algorithms::covreach::
algorithm_t<tchecker::refzg::refzg_t,_tchecker::tck_reach::concur19::graph_t>::expand_next_nodes
          (algorithm_t<tchecker::refzg::refzg_t,_tchecker::tck_reach::concur19::graph_t> *this,
          node_sptr_t *node,refzg_t *ts,graph_t *graph,
          vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>_>_>
          *next_nodes,stats_t *stats)

{
  make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL> *pmVar1;
  pointer ptVar2;
  bool bVar3;
  unsigned_long *puVar4;
  overflow_error *this_00;
  make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL> *pmVar5;
  pointer ptVar6;
  node_sptr_t next_node;
  vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>_>_>
  sst;
  const_state_sptr_t local_80;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>
  local_78;
  node_sptr_t *local_70;
  vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>_>_>
  local_68;
  vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>_>_>
  *local_48;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>
  local_40;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>
  local_38;
  
  local_68.
  super__Vector_base<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78._t = (make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>
                 *)0x0;
  local_70 = node;
  local_48 = next_nodes;
  if (node->_t ==
      (make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>
       *)0x0) {
    __assert_fail("_t != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                  ,0x1db,
                  "T *tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t, tchecker::tck_reach::concur19::edge_t>>>::operator->() const [T = tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t, tchecker::tck_reach::concur19::edge_t>>]"
                 );
  }
  local_80._t = (node->_t->
                super_node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>
                ).super_node_t.super_node_refzg_state_t._state._t;
  if (local_80._t != (make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL> *)0x0) {
    pmVar5 = (make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL> *)
             ((long)&((local_80._t[-1].super_state_t._zone._t)->super_zone_t)._vptr_zone_t + 1);
    local_80._t[-1].super_state_t._zone._t = pmVar5;
    if (pmVar5 == (make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL> *)0xfffffffffffffffe)
    {
      this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
      std::overflow_error::overflow_error(this_00,"reference counter overflow");
      __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
    }
  }
  refzg::refzg_t::next(ts,&local_80,&local_68,1);
  intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>
  ::~intrusive_shared_ptr_t(&local_80);
  ptVar2 = local_68.
           super__Vector_base<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_68.
      super__Vector_base<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_68.
      super__Vector_base<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ptVar6 = local_68.
             super__Vector_base<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      puVar4 = stats_t::visited_transitions(stats);
      *puVar4 = *puVar4 + 1;
      tchecker::graph::subsumption::
      graph_t<tchecker::tck_reach::concur19::node_t,tchecker::tck_reach::concur19::edge_t,tchecker::tck_reach::concur19::node_hash_t,tchecker::tck_reach::concur19::node_le_t>
      ::
      add_node<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,unsigned_long,1ul>>&>
                ((graph_t<tchecker::tck_reach::concur19::node_t,tchecker::tck_reach::concur19::edge_t,tchecker::tck_reach::concur19::node_hash_t,tchecker::tck_reach::concur19::node_le_t>
                  *)&local_80,
                 (intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>
                  *)graph);
      bVar3 = tchecker::graph::cover::
              graph_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>,_tchecker::graph::subsumption::graph_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t,_tchecker::tck_reach::concur19::node_hash_t,_tchecker::tck_reach::concur19::node_le_t>::node_sptr_hash_t,_tchecker::graph::subsumption::graph_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t,_tchecker::tck_reach::concur19::node_hash_t,_tchecker::tck_reach::concur19::node_le_t>::node_sptr_le_t>
              ::is_covered(&(graph->
                            super_graph_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t,_tchecker::tck_reach::concur19::node_hash_t,_tchecker::tck_reach::concur19::node_le_t>
                            )._cover_graph,
                           (intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>
                            *)&local_80,&local_78);
      pmVar1 = (ptVar6->
               super__Tuple_impl<0UL,_unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>
               ).
               super__Tuple_impl<1UL,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>
               .
               super__Tuple_impl<2UL,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>
               .
               super__Head_base<2UL,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>,_false>
               ._M_head_impl._t;
      if (bVar3) {
        if (pmVar1 == (make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL> *)0x0) {
LAB_0012b3e4:
          __assert_fail("_t != nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                        ,0x1d0,
                        "T &tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t>>::operator*() const [T = tchecker::make_shared_t<tchecker::refzg::transition_t>]"
                       );
        }
        tchecker::graph::subsumption::
        graph_t<tchecker::tck_reach::concur19::node_t,tchecker::tck_reach::concur19::edge_t,tchecker::tck_reach::concur19::node_hash_t,tchecker::tck_reach::concur19::node_le_t>
        ::add_edge<tchecker::make_shared_t<tchecker::refzg::transition_t,unsigned_long,1ul>&>
                  ((graph_t<tchecker::tck_reach::concur19::node_t,tchecker::tck_reach::concur19::edge_t,tchecker::tck_reach::concur19::node_hash_t,tchecker::tck_reach::concur19::node_le_t>
                    *)&local_38,(node_sptr_t *)graph,local_70,(edge_type_t)&local_78,
                   (make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL> *)0x1);
        intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>
        ::~intrusive_shared_ptr_t(&local_38);
        tchecker::graph::subsumption::
        graph_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t,_tchecker::tck_reach::concur19::node_hash_t,_tchecker::tck_reach::concur19::node_le_t>
        ::remove_node(&graph->
                       super_graph_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t,_tchecker::tck_reach::concur19::node_hash_t,_tchecker::tck_reach::concur19::node_le_t>
                      ,(node_sptr_t *)&local_80);
        puVar4 = stats_t::covered_states(stats);
        *puVar4 = *puVar4 + 1;
      }
      else {
        if (pmVar1 == (make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL> *)0x0)
        goto LAB_0012b3e4;
        tchecker::graph::subsumption::
        graph_t<tchecker::tck_reach::concur19::node_t,tchecker::tck_reach::concur19::edge_t,tchecker::tck_reach::concur19::node_hash_t,tchecker::tck_reach::concur19::node_le_t>
        ::add_edge<tchecker::make_shared_t<tchecker::refzg::transition_t,unsigned_long,1ul>&>
                  ((graph_t<tchecker::tck_reach::concur19::node_t,tchecker::tck_reach::concur19::edge_t,tchecker::tck_reach::concur19::node_hash_t,tchecker::tck_reach::concur19::node_le_t>
                    *)&local_40,(node_sptr_t *)graph,local_70,
                   (edge_type_t)
                   (graph_t<tchecker::tck_reach::concur19::node_t,tchecker::tck_reach::concur19::edge_t,tchecker::tck_reach::concur19::node_hash_t,tchecker::tck_reach::concur19::node_le_t>
                    *)&local_80,
                   (make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL> *)0x0);
        intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>
        ::~intrusive_shared_ptr_t(&local_40);
        std::
        vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>_>_>
        ::push_back(local_48,(value_type *)&local_80);
      }
      intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>
      ::~intrusive_shared_ptr_t
                ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>
                  *)&local_80);
      ptVar6 = ptVar6 + 1;
    } while (ptVar6 != ptVar2);
  }
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::concur19::node_t,_tchecker::tck_reach::concur19::edge_t>,_unsigned_long,_1UL>_>
  ::~intrusive_shared_ptr_t(&local_78);
  std::
  vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::transition_t,_unsigned_long,_1UL>_>_>_>_>
  ::~vector(&local_68);
  return;
}

Assistant:

void expand_next_nodes(typename GRAPH::node_sptr_t const & node, TS & ts, GRAPH & graph,
                         std::vector<typename GRAPH::node_sptr_t> & next_nodes, tchecker::algorithms::covreach::stats_t & stats)
  {
    std::vector<typename TS::sst_t> sst;
    typename GRAPH::node_sptr_t covering_node;

    ts.next(node->state_ptr(), sst);
    for (auto && [status, s, t] : sst) {
      ++stats.visited_transitions();
      typename GRAPH::node_sptr_t next_node = graph.add_node(s);
      if (graph.is_covered(next_node, covering_node)) {
        graph.add_edge(node, covering_node, tchecker::graph::subsumption::EDGE_SUBSUMPTION, *t);
        graph.remove_node(next_node);
        ++stats.covered_states();
      }
      else {
        graph.add_edge(node, next_node, tchecker::graph::subsumption::EDGE_ACTUAL, *t);
        next_nodes.push_back(next_node);
      }
    }
  }